

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::FailureMessage::simple_abi_cxx11_
          (string *__return_storage_ptr__,FailureMessage *this,App *app,Error *e)

{
  int iVar1;
  undefined4 extraout_var;
  Option *pOVar2;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  App *local_20;
  Error *e_local;
  App *app_local;
  string *header;
  
  local_21 = 0;
  local_20 = app;
  e_local = (Error *)this;
  app_local = (App *)__return_storage_ptr__;
  iVar1 = (*app->_vptr_App[2])();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(char *)CONCAT44(extraout_var,iVar1),&local_49);
  ::std::operator+(__return_storage_ptr__,&local_48,"\n");
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pOVar2 = App::get_help_ptr((App *)e_local);
  if (pOVar2 != (Option *)0x0) {
    pOVar2 = App::get_help_ptr((App *)e_local);
    Option::get_name_abi_cxx11_(&local_c0,pOVar2,false,false);
    ::std::operator+(&local_a0,"Run with ",&local_c0);
    ::std::operator+(&local_80,&local_a0," for more information.\n");
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string simple(const App *app, const Error &e) {
    std::string header = std::string(e.what()) + "\n";
    if(app->get_help_ptr() != nullptr)
        header += "Run with " + app->get_help_ptr()->get_name() + " for more information.\n";
    return header;
}